

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O3

error_code __thiscall
simdjson::haswell::implementation::create_dom_parser_implementation
          (implementation *this,size_t capacity,size_t max_depth,
          unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
          *dst)

{
  dom_parser_implementation *pdVar1;
  error_code eVar2;
  dom_parser_implementation *pdVar3;
  undefined1 auVar4 [32];
  
  pdVar3 = (dom_parser_implementation *)operator_new(0x58,(nothrow_t *)&std::nothrow);
  if (pdVar3 != (dom_parser_implementation *)0x0) {
    pdVar3->n_structural_indexes = 0;
    (pdVar3->structural_indexes)._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> =
         (__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>)0x0;
    pdVar3->next_structural_index = 0;
    pdVar3->_capacity = 0;
    pdVar3->_max_depth = 0;
    pdVar3->_vptr_dom_parser_implementation = (_func_int **)&PTR_parse_001e8428;
    auVar4 = ZEXT432(0) << 0x40;
    pdVar3[1]._vptr_dom_parser_implementation = (_func_int **)auVar4._0_8_;
    pdVar3[1].n_structural_indexes = auVar4._8_4_;
    *(int *)&pdVar3[1].field_0xc = auVar4._12_4_;
    pdVar3[1].structural_indexes =
         (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)auVar4._16_8_;
    pdVar3[1].next_structural_index = auVar4._24_4_;
    *(int *)&pdVar3[1].field_0x1c = auVar4._28_4_;
    pdVar3[1]._capacity = 0;
  }
  pdVar1 = (dst->_M_t).
           super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
           .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
           _M_head_impl;
  (dst->_M_t).
  super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
  ._M_t.
  super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
  .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>._M_head_impl =
       pdVar3;
  if (pdVar1 != (dom_parser_implementation *)0x0) {
    (*pdVar1->_vptr_dom_parser_implementation[7])();
    pdVar3 = (dst->_M_t).
             super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
             .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
             _M_head_impl;
  }
  if (pdVar3 == (dom_parser_implementation *)0x0) {
    eVar2 = MEMALLOC;
  }
  else {
    eVar2 = (*pdVar3->_vptr_dom_parser_implementation[4])(pdVar3,capacity);
    if (eVar2 == SUCCESS) {
      pdVar3 = (dst->_M_t).
               super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
               .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
               _M_head_impl;
      eVar2 = (*pdVar3->_vptr_dom_parser_implementation[5])(pdVar3,max_depth);
      return eVar2;
    }
  }
  return eVar2;
}

Assistant:

simdjson_warn_unused error_code implementation::create_dom_parser_implementation(
  size_t capacity,
  size_t max_depth,
  std::unique_ptr<internal::dom_parser_implementation>& dst
) const noexcept {
  dst.reset( new (std::nothrow) dom_parser_implementation() );
  if (!dst) { return MEMALLOC; }
  if (auto err = dst->set_capacity(capacity))
    return err;
  if (auto err = dst->set_max_depth(max_depth))
    return err;
  return SUCCESS;
}